

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

char * cmSourceFileGetProperty(void *arg,char *prop)

{
  cmSourceFile *this;
  int iVar1;
  char *unaff_R15;
  allocator<char> local_41;
  string local_40;
  
  this = *arg;
  if (this != (cmSourceFile *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,prop,&local_41);
    unaff_R15 = cmSourceFile::GetProperty(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (this == (cmSourceFile *)0x0) {
    iVar1 = strcmp(prop,"LOCATION");
    if (iVar1 == 0) {
      unaff_R15 = *(char **)((long)arg + 0x48);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,prop,&local_41);
      unaff_R15 = cmPropertyMap::GetPropertyValue((cmPropertyMap *)((long)arg + 0x80),&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return unaff_R15;
}

Assistant:

const char* CCONV cmSourceFileGetProperty(void* arg, const char* prop)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    return rsf->GetProperty(prop);
  }
  if (!strcmp(prop, "LOCATION")) {
    return sf->FullPath.c_str();
  }
  return sf->Properties.GetPropertyValue(prop);
}